

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void free_esni_secret(ptls_esni_secret_t **esni,int is_server)

{
  uint8_t *puVar1;
  ptls_esni_secret_t *ppVar2;
  
  ppVar2 = *esni;
  if (ppVar2 != (ptls_esni_secret_t *)0x0) {
    puVar1 = (ppVar2->secret).base;
    if (puVar1 != (uint8_t *)0x0) {
      (*ptls_clear_memory)(puVar1,(ppVar2->secret).len);
      free(((*esni)->secret).base);
      ppVar2 = *esni;
    }
    if (is_server == 0) {
      free((ppVar2->client).pubkey.base);
      ppVar2 = *esni;
    }
    (*ptls_clear_memory)(ppVar2,0xd0);
    free(*esni);
    *esni = (ptls_esni_secret_t *)0x0;
    return;
  }
  __assert_fail("*esni != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                ,0x709,"void free_esni_secret(ptls_esni_secret_t **, int)");
}

Assistant:

static void free_esni_secret(ptls_esni_secret_t **esni, int is_server)
{
    assert(*esni != NULL);
    if ((*esni)->secret.base != NULL) {
        ptls_clear_memory((*esni)->secret.base, (*esni)->secret.len);
        free((*esni)->secret.base);
    }
    if (!is_server)
        free((*esni)->client.pubkey.base);
    ptls_clear_memory((*esni), sizeof(**esni));
    free(*esni);
    *esni = NULL;
}